

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O3

void __thiscall xray_re::xr_swibuf::load(xr_swibuf *this,xr_reader *r)

{
  ogf4_slide_window *poVar1;
  uint8_t *puVar2;
  ogf4_slide_window *p;
  long lVar3;
  ogf4_slide_window *poVar4;
  uint32_t *puVar5;
  uint16_t *puVar6;
  ulong uVar7;
  
  (this->super_xr_flexbuf).m_owner = true;
  (this->super_xr_flexbuf).m_size = 0;
  puVar5 = (r->field_2).m_p_u32;
  lVar3 = 0;
  do {
    *(uint32_t *)((long)this->m_reserved + lVar3) = *puVar5;
    puVar2 = (r->field_2).m_p;
    puVar5 = (uint32_t *)(puVar2 + 4);
    (r->field_2).m_p_u32 = puVar5;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  (r->field_2).m_p = puVar2 + 8;
  uVar7 = (ulong)*(uint *)(puVar2 + 4);
  if (uVar7 != 0) {
    poVar4 = (ogf4_slide_window *)operator_new__(uVar7 * 8);
    this->m_slide_windows = poVar4;
    poVar1 = poVar4 + uVar7;
    puVar6 = (uint16_t *)((r->field_2).m_p + 4);
    do {
      (r->field_2).m_p_u16 = puVar6;
      poVar4->offset = *(uint32_t *)(puVar6 + -2);
      (r->field_2).m_p = (uint8_t *)(puVar6 + 1);
      poVar4->num_tris = *puVar6;
      (r->field_2).m_p = (uint8_t *)(puVar6 + 2);
      poVar4->num_verts = puVar6[1];
      poVar4 = poVar4 + 1;
      puVar6 = puVar6 + 4;
    } while (poVar4 != poVar1);
    return;
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0x218,"void xray_re::xr_swibuf::load(xr_reader &)");
}

Assistant:

void xr_swibuf::load(xr_reader& r)
{
	xr_flexbuf::clear();
	r.r_cseq<uint32_t>(4, m_reserved);
	size_t n = r.r_u32();
	xr_assert(n > 0);
	m_slide_windows = new ogf4_slide_window[n];
	r.r_cseq(n, m_slide_windows, read_sw());
}